

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution-test.c++
# Opt level: O2

void capnp::compiler::anon_unknown_0::checkExampleStruct(Reader reader,uint sharedOrdinalCount)

{
  Field field_00;
  Field field_01;
  Field field_02;
  Field field_03;
  uint uVar1;
  uint uVar2;
  StructSchema schema;
  Field field;
  FieldSubset unionFields;
  Schema local_150;
  IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field> local_148;
  Field local_138;
  undefined8 in_stack_ffffffffffffff10;
  SegmentReader *in_stack_ffffffffffffff18;
  CapTableReader *in_stack_ffffffffffffff20;
  void *in_stack_ffffffffffffff28;
  WirePointer *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  Schema in_stack_ffffffffffffff48;
  uint local_78;
  Field local_70;
  
  local_150 = reader.schema.super_Schema.raw;
  StructSchema::getNonUnionFields
            ((FieldSubset *)&stack0xffffffffffffff48,(StructSchema *)&local_150);
  local_148.container = (FieldSubset *)&stack0xffffffffffffff48;
  for (local_148.index = 0; local_148.index != local_78; local_148.index = local_148.index + 1) {
    capnp::_::IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field>::
    operator*(&local_138,&local_148);
    field_00.index = local_138.index;
    field_00._12_4_ = local_138._12_4_;
    field_00.parent.super_Schema.raw = local_138.parent.super_Schema.raw;
    field_00.proto._reader.segment = local_138.proto._reader.segment;
    field_00.proto._reader.capTable = local_138.proto._reader.capTable;
    field_00.proto._reader.data = local_138.proto._reader.data;
    field_00.proto._reader.pointers = local_138.proto._reader.pointers;
    field_00.proto._reader.dataSize = local_138.proto._reader.dataSize;
    field_00.proto._reader.pointerCount = local_138.proto._reader.pointerCount;
    field_00.proto._reader._38_2_ = local_138.proto._reader._38_2_;
    field_00.proto._reader.nestingLimit = local_138.proto._reader.nestingLimit;
    field_00.proto._reader._44_4_ = local_138.proto._reader._44_4_;
    checkExampleField(reader,field_00,sharedOrdinalCount);
  }
  StructSchema::getUnionFields((FieldSubset *)&stack0xffffffffffffff48,(StructSchema *)&local_150);
  uVar2 = local_78 + 1;
  do {
    if (uVar2 == 1) {
      return;
    }
    StructSchema::FieldSubset::operator[]
              ((Field *)&stack0xffffffffffffff08,(FieldSubset *)&stack0xffffffffffffff48,uVar2 - 2);
    field_02._8_8_ = in_stack_ffffffffffffff18;
    field_02.parent.super_Schema.raw = (Schema)(Schema)in_stack_ffffffffffffff10;
    field_02.proto._reader.segment = (SegmentReader *)in_stack_ffffffffffffff20;
    field_02.proto._reader.capTable = (CapTableReader *)in_stack_ffffffffffffff28;
    field_02.proto._reader.data = in_stack_ffffffffffffff30;
    field_02.proto._reader.pointers = (WirePointer *)in_stack_ffffffffffffff38;
    field_02.proto._reader.dataSize = (int)in_stack_ffffffffffffff40;
    field_02.proto._reader.pointerCount = SUB82(in_stack_ffffffffffffff40,4);
    field_02.proto._reader._38_2_ = SUB82(in_stack_ffffffffffffff40,6);
    field_02.proto._reader._40_8_ = in_stack_ffffffffffffff48.raw;
    uVar1 = getOrdinal(field_02);
    uVar2 = uVar2 - 1;
  } while (sharedOrdinalCount <= uVar1);
  StructSchema::FieldSubset::operator[](&local_70,(FieldSubset *)&stack0xffffffffffffff48,0);
  field_03._8_8_ = in_stack_ffffffffffffff18;
  field_03.parent.super_Schema.raw = (Schema)(Schema)in_stack_ffffffffffffff10;
  field_03.proto._reader.segment = (SegmentReader *)in_stack_ffffffffffffff20;
  field_03.proto._reader.capTable = (CapTableReader *)in_stack_ffffffffffffff28;
  field_03.proto._reader.data = in_stack_ffffffffffffff30;
  field_03.proto._reader.pointers = (WirePointer *)in_stack_ffffffffffffff38;
  field_03.proto._reader.dataSize = (int)in_stack_ffffffffffffff40;
  field_03.proto._reader.pointerCount = SUB82(in_stack_ffffffffffffff40,4);
  field_03.proto._reader._38_2_ = SUB82(in_stack_ffffffffffffff40,6);
  field_03.proto._reader._40_8_ = in_stack_ffffffffffffff48.raw;
  uVar1 = getOrdinal(field_03);
  StructSchema::FieldSubset::operator[]
            (&local_138,(FieldSubset *)&stack0xffffffffffffff48,uVar1 % uVar2);
  field_01.index = local_138.index;
  field_01._12_4_ = local_138._12_4_;
  field_01.parent.super_Schema.raw = local_138.parent.super_Schema.raw;
  field_01.proto._reader.segment = local_138.proto._reader.segment;
  field_01.proto._reader.capTable = local_138.proto._reader.capTable;
  field_01.proto._reader.data = local_138.proto._reader.data;
  field_01.proto._reader.pointers = local_138.proto._reader.pointers;
  field_01.proto._reader.dataSize = local_138.proto._reader.dataSize;
  field_01.proto._reader.pointerCount = local_138.proto._reader.pointerCount;
  field_01.proto._reader._38_2_ = local_138.proto._reader._38_2_;
  field_01.proto._reader.nestingLimit = local_138.proto._reader.nestingLimit;
  field_01.proto._reader._44_4_ = local_138.proto._reader._44_4_;
  checkExampleField(reader,field_01,sharedOrdinalCount);
  return;
}

Assistant:

void checkExampleStruct(DynamicStruct::Reader reader, uint sharedOrdinalCount) {
  auto schema = reader.getSchema();

  for (auto field: schema.getNonUnionFields()) {
    checkExampleField(reader, field, sharedOrdinalCount);
  }

  auto unionFields = schema.getUnionFields();

  // Pretend the union doesn't have any fields that aren't in the shared ordinal range.
  uint range = unionFields.size();
  while (range > 0 && getOrdinal(unionFields[range - 1]) >= sharedOrdinalCount) {
    --range;
  }

  if (range > 0) {
    auto field = unionFields[getOrdinal(unionFields[0]) % range];
    checkExampleField(reader, field, sharedOrdinalCount);
  }
}